

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 __thiscall
unodb::detail::olc_impl_helpers::
add_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,value_view v,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          tree_depth<unodb::detail::basic_art_key<unsigned_long>_> depth,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,read_critical_section *parent_critical_section,
          olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *cached_leaf)

{
  atomic<long> *paVar1;
  long lVar2;
  olc_impl_helpers children_count_;
  write_guard ptr_;
  optimistic_lock *poVar3;
  undefined4 uVar4;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aVar5;
  undefined8 uVar6;
  undefined7 in_register_00000011;
  __extent_storage<18446744073709551615UL> db_instance_00;
  __extent_storage<18446744073709551615UL> db_instance_01;
  find_result fVar7;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar8;
  undefined4 in_stack_00000014;
  write_guard local_58;
  write_guard write_unlock_on_exit;
  write_guard local_48;
  write_guard write_unlock_on_exit_1;
  write_guard node_write_guard;
  
  db_instance_00 = v._M_extent._M_extent_value;
  aVar5 = k.field_0;
  db_instance_01._M_extent_value = db_instance_00._M_extent_value;
  fVar7 = basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::find_child((basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        *)this,(byte)inode);
  uVar4 = (undefined4)CONCAT71((int7)((ulong)aVar5 >> 8),1);
  if (fVar7.second !=
      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0)
  goto LAB_001b1bd7;
  create_leaf_if_needed<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)parent_critical_section,
             (olc_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>_> *)
             CONCAT71(in_register_00000011,key_byte),k,v,
             (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             db_instance_01._M_extent_value);
  children_count_ = this[0x20];
  if (children_count_ != (olc_impl_helpers)0x10) {
    local_58.lock =
         optimistic_lock::write_guard::try_lock_upgrade
                   ((read_critical_section *)CONCAT44(in_stack_00000014,depth.value));
    if (local_58.lock != (optimistic_lock *)0x0) {
      poVar3 = (optimistic_lock *)(node_in_parent->value)._M_i.tagged_ptr;
      if ((poVar3->read_lock_count).super___atomic_base<long>._M_i < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      if (node_in_parent[1].value._M_i.tagged_ptr ==
          (poVar3->version).version.super___atomic_base<unsigned_long>._M_i) {
        LOCK();
        paVar1 = &poVar3->read_lock_count;
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        (node_in_parent->value)._M_i.tagged_ptr = 0;
        uVar6 = 0;
        basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::add_to_nonfull((basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                          *)this,(db_leaf_unique_ptr *)parent_critical_section,db_instance._0_4_,
                         (uint8_t)children_count_);
        optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffa8);
        uVar4 = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),1);
        goto LAB_001b1bd7;
      }
      optimistic_lock::dec_read_lock_count(poVar3);
      (node_in_parent->value)._M_i.tagged_ptr = 0;
    }
    optimistic_lock::write_guard::~write_guard(&stack0xffffffffffffffa8);
    uVar4 = 0;
    goto LAB_001b1bd7;
  }
  basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
  ::
  make_db_inode_unique_ptr<unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
            ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              *)&stack0xffffffffffffffa8,(db_type *)db_instance_00._M_extent_value,
             (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             this);
  local_48.lock =
       optimistic_lock::write_guard::try_lock_upgrade((read_critical_section *)node_in_parent);
  if (local_48.lock == (optimistic_lock *)0x0) {
LAB_001b1cfd:
    optimistic_lock::write_guard::~write_guard(&local_48);
    uVar4 = 0;
  }
  else {
    write_unlock_on_exit_1.lock =
         optimistic_lock::write_guard::try_lock_upgrade
                   ((read_critical_section *)CONCAT44(in_stack_00000014,depth.value));
    if (write_unlock_on_exit_1.lock == (optimistic_lock *)0x0) {
      optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
      goto LAB_001b1cfd;
    }
    olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::init
              ((olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
               write_unlock_on_exit.lock,(EVP_PKEY_CTX *)db_instance_00._M_extent_value);
    ptr_ = write_unlock_on_exit;
    write_unlock_on_exit.lock = (optimistic_lock *)0x0;
    poVar3 = (optimistic_lock *)
             basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(ptr_.lock,I48);
    node_critical_section->lock = poVar3;
    if (write_unlock_on_exit_1.lock != (optimistic_lock *)0x0) {
      __assert_fail("!node_write_guard.active()",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x5b8,
                    "static std::optional<in_critical_section<olc_node_ptr> *> unodb::detail::olc_impl_helpers::add_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, value_view, olc_db<Key, Value> &, tree_depth<basic_art_key<Key>>, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, optimistic_lock::read_critical_section &, olc_db_leaf_unique_ptr<Key, Value> &) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                   );
    }
    optimistic_lock::write_guard::~write_guard(&write_unlock_on_exit_1);
    optimistic_lock::write_guard::~write_guard(&local_48);
    LOCK();
    (((atomic<unsigned_long> *)(db_instance_00._M_extent_value + 0x210))->
    super___atomic_base<unsigned_long>)._M_i =
         (((atomic<unsigned_long> *)(db_instance_00._M_extent_value + 0x210))->
         super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    uVar4 = (undefined4)CONCAT71((int7)((ulong)&write_unlock_on_exit_1 >> 8),1);
  }
  std::
  unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&stack0xffffffffffffffa8);
LAB_001b1bd7:
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_4_ = uVar4;
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = fVar7.second;
  oVar8.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._12_4_ = 0;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar8.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}